

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O1

void disas_simd_scalar_shift_imm(DisasContext_conflict1 *s,uint32_t insn)

{
  byte bVar1;
  uint opcode;
  TCGv_i64 pTVar2;
  TCGv_i64 pTVar3;
  sbyte sVar4;
  uint rd;
  _Bool _Var5;
  TCGContext_conflict1 *s_00;
  _Bool _Var6;
  uint32_t target_el;
  byte bVar7;
  uint immb;
  uintptr_t o;
  TCGTemp *pTVar8;
  uint uVar9;
  int iVar10;
  uint rn;
  int in_stack_ffffffffffffffa8;
  TCGContext_conflict1 *tcg_ctx;
  TCGv_i64 local_48;
  
  uVar9 = insn >> 0x13 & 0xf;
  if ((uVar9 == 0) || (opcode = insn >> 0xb & 0x1f, 0x1f < opcode)) goto switchD_006b08db_caseD_1;
  rd = insn & 0x1f;
  rn = insn >> 5 & 0x1f;
  immb = insn >> 0x10 & 7;
  bVar1 = (byte)(insn >> 0x18);
  switch(opcode) {
  default:
    goto switchD_006b08db_caseD_1;
  case 8:
    if ((insn >> 0x1d & 1) == 0) goto switchD_006b08db_caseD_1;
  case 0:
  case 2:
  case 4:
  case 6:
    if ((insn >> 0x16 & 1) == 0) {
switchD_006b08db_caseD_1:
      unallocated_encoding_aarch64(s);
      return;
    }
    if (s->fp_access_checked == true) {
LAB_006b0ccb:
      __assert_fail("!s->fp_access_checked",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                    ,0x487,"_Bool fp_access_check(DisasContext *)");
    }
    tcg_ctx = s->uc->tcg_ctx;
    s->fp_access_checked = true;
    target_el = s->fp_excp_el;
    if (target_el != 0) {
LAB_006b0918:
      gen_exception_insn(s,s->pc_curr,1,0x1fe0000a,target_el);
      return;
    }
    sVar4 = (sbyte)opcode;
    iVar10 = immb + uVar9 * 8;
    if ((0x50U >> opcode & 1) == 0) {
      local_48 = (TCGv_i64)0x0;
    }
    else {
      local_48 = tcg_const_i64_aarch64(tcg_ctx,1L << (~(byte)iVar10 & 0x3f));
    }
    pTVar2 = read_fp_dreg(s,rn);
    bVar7 = (byte)(0x44 >> sVar4);
    if ((((byte)(0x100U >> sVar4) | bVar7) & 1) == 0) {
      s_00 = tcg_ctx;
      pTVar8 = tcg_temp_new_internal_aarch64(tcg_ctx,TCG_TYPE_I64,false);
      pTVar3 = (TCGv_i64)((long)pTVar8 - (long)tcg_ctx);
    }
    else {
      pTVar3 = read_fp_dreg(s,rd);
      s_00 = tcg_ctx;
    }
    if ((0x100U >> sVar4 & 1) == 0) {
      handle_shri_with_rndacc
                (s_00,pTVar3,pTVar2,local_48,(_Bool)(bVar7 & 1),(_Bool)(bVar1 >> 5 & 1),3,
                 0x80U - iVar10);
    }
    else if (iVar10 != 0x40) {
      tcg_gen_shri_i64_aarch64(s_00,pTVar2,pTVar2,(ulong)(0x80U - iVar10));
      tcg_gen_deposit_i64_aarch64(s_00,pTVar3,pTVar3,pTVar2,0,iVar10 - 0x40);
    }
    write_fp_dreg_aarch64(s,rd,pTVar3);
    tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(pTVar2 + (long)s_00));
    tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(pTVar3 + (long)s_00));
    if ((0x50U >> sVar4 & 1) != 0) {
      pTVar8 = (TCGTemp *)(local_48 + (long)s_00);
LAB_006b0cb8:
      tcg_temp_free_internal_aarch64(s_00,pTVar8);
      return;
    }
    break;
  case 10:
    s_00 = s->uc->tcg_ctx;
    iVar10 = 0x1f;
    if (uVar9 != 0) {
      for (; uVar9 >> iVar10 == 0; iVar10 = iVar10 + -1) {
      }
    }
    new_tmp_a64_aarch64(s);
    new_tmp_a64_aarch64(s);
    if ((insn >> 0x16 & 1) == 0) goto switchD_006b08db_caseD_1;
    if (s->fp_access_checked == true) goto LAB_006b0ccb;
    s->fp_access_checked = true;
    target_el = s->fp_excp_el;
    if (target_el != 0) goto LAB_006b0918;
    pTVar2 = read_fp_dreg(s,rn);
    if ((insn >> 0x1d & 1) == 0) {
      pTVar8 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I64,false);
      pTVar3 = (TCGv_i64)((long)pTVar8 - (long)s_00);
    }
    else {
      pTVar3 = read_fp_dreg(s,rd);
    }
    uVar9 = immb + uVar9 * 8 + (-8 << ((byte)iVar10 & 0x1f));
    if ((insn >> 0x1d & 1) == 0) {
      tcg_gen_shli_i64_aarch64(s_00,pTVar3,pTVar2,(long)(int)uVar9);
    }
    else {
      tcg_gen_deposit_i64_aarch64(s_00,pTVar3,pTVar3,pTVar2,uVar9,0x40 - uVar9);
    }
    write_fp_dreg_aarch64(s,rd,pTVar3);
    tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(pTVar2 + (long)s_00));
    pTVar8 = (TCGTemp *)(pTVar3 + (long)s_00);
    goto LAB_006b0cb8;
  case 0xc:
    if ((insn >> 0x1d & 1) == 0) goto switchD_006b08db_caseD_1;
    _Var5 = false;
    _Var6 = true;
    goto LAB_006b0a6d;
  case 0xe:
    _Var5 = (_Bool)(bVar1 >> 5 & 1);
    _Var6 = _Var5;
LAB_006b0a6d:
    handle_simd_qshl(s,true,false,_Var5,_Var6,uVar9,immb,rn,rd);
    break;
  case 0x10:
  case 0x11:
    if ((insn >> 0x1d & 1) != 0) {
      _Var5 = false;
      _Var6 = true;
      goto LAB_006b096f;
    }
    goto switchD_006b08db_caseD_1;
  case 0x12:
  case 0x13:
    _Var5 = (_Bool)(bVar1 >> 5 & 1);
    _Var6 = _Var5;
LAB_006b096f:
    handle_vec_simd_sqshrn(s,true,false,_Var5,_Var6,uVar9,immb,opcode,rn,rd);
    return;
  case 0x1c:
    handle_simd_shift_intfp_conv
              (s,true,false,(_Bool)(bVar1 >> 5 & 1),uVar9,immb,rn,rd,in_stack_ffffffffffffffa8);
    return;
  case 0x1f:
    handle_simd_shift_fpint_conv(s,true,false,(_Bool)(bVar1 >> 5 & 1),uVar9,immb,rn,rd);
    return;
  }
  return;
}

Assistant:

static void disas_simd_scalar_shift_imm(DisasContext *s, uint32_t insn)
{
    int rd = extract32(insn, 0, 5);
    int rn = extract32(insn, 5, 5);
    int opcode = extract32(insn, 11, 5);
    int immb = extract32(insn, 16, 3);
    int immh = extract32(insn, 19, 4);
    bool is_u = extract32(insn, 29, 1);

    if (immh == 0) {
        unallocated_encoding(s);
        return;
    }

    switch (opcode) {
    case 0x08: /* SRI */
        if (!is_u) {
            unallocated_encoding(s);
            return;
        }
        /* fall through */
    case 0x00: /* SSHR / USHR */
    case 0x02: /* SSRA / USRA */
    case 0x04: /* SRSHR / URSHR */
    case 0x06: /* SRSRA / URSRA */
        handle_scalar_simd_shri(s, is_u, immh, immb, opcode, rn, rd);
        break;
    case 0x0a: /* SHL / SLI */
        handle_scalar_simd_shli(s, is_u, immh, immb, opcode, rn, rd);
        break;
    case 0x1c: /* SCVTF, UCVTF */
        handle_simd_shift_intfp_conv(s, true, false, is_u, immh, immb,
                                     opcode, rn, rd);
        break;
    case 0x10: /* SQSHRUN, SQSHRUN2 */
    case 0x11: /* SQRSHRUN, SQRSHRUN2 */
        if (!is_u) {
            unallocated_encoding(s);
            return;
        }
        handle_vec_simd_sqshrn(s, true, false, false, true,
                               immh, immb, opcode, rn, rd);
        break;
    case 0x12: /* SQSHRN, SQSHRN2, UQSHRN */
    case 0x13: /* SQRSHRN, SQRSHRN2, UQRSHRN, UQRSHRN2 */
        handle_vec_simd_sqshrn(s, true, false, is_u, is_u,
                               immh, immb, opcode, rn, rd);
        break;
    case 0xc: /* SQSHLU */
        if (!is_u) {
            unallocated_encoding(s);
            return;
        }
        handle_simd_qshl(s, true, false, false, true, immh, immb, rn, rd);
        break;
    case 0xe: /* SQSHL, UQSHL */
        handle_simd_qshl(s, true, false, is_u, is_u, immh, immb, rn, rd);
        break;
    case 0x1f: /* FCVTZS, FCVTZU */
        handle_simd_shift_fpint_conv(s, true, false, is_u, immh, immb, rn, rd);
        break;
    default:
        unallocated_encoding(s);
        break;
    }
}